

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall cxxopts::Options::parse_positional<char_const*>(Options *this,char *begin,char *end)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffef0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffef8;
  Options *in_stack_ffffffffffffff00;
  allocator_type *in_stack_ffffffffffffff08;
  allocator<char> *in_stack_ffffffffffffff10;
  string *psVar1;
  iterator in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  undefined1 *puVar2;
  undefined1 local_9f;
  undefined1 local_9e;
  allocator<char> local_9d [20];
  allocator<char> local_89;
  string *local_88;
  string local_80 [32];
  undefined1 local_60 [32];
  string *local_40;
  undefined8 local_38;
  
  local_9e = 1;
  local_88 = local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  local_88 = (string *)local_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  local_9e = 0;
  local_40 = local_80;
  local_38 = 2;
  puVar2 = &local_9f;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x1aefa4);
  __l._M_len = (size_type)puVar2;
  __l._M_array = in_stack_ffffffffffffff18;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffff10,__l,in_stack_ffffffffffffff08);
  parse_positional(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffef0);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x1aeff6);
  psVar1 = local_80;
  this_00 = (string *)&local_40;
  do {
    this_00 = this_00 + -0x20;
    std::__cxx11::string::~string(this_00);
  } while (this_00 != psVar1);
  std::allocator<char>::~allocator(local_9d);
  std::allocator<char>::~allocator(&local_89);
  return;
}

Assistant:

void
  parse_positional(Iterator begin, Iterator end) {
    parse_positional(std::vector<std::string>{begin, end});
  }